

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_i(void *ctx,char *next)

{
  size_t sVar1;
  char *__dest;
  RK_S32 RVar2;
  
  if (next == (char *)0x0) {
    RVar2 = 0;
    _mpp_log_l(2,"mpi_enc_utils","input file is invalid\n",0);
  }
  else {
    sVar1 = strnlen(next,0x100);
    RVar2 = 1;
    if (sVar1 != 0) {
      __dest = (char *)mpp_osal_calloc("mpi_enc_opt_i",sVar1 + 1);
      *(char **)ctx = __dest;
      strcpy(__dest,next);
      name_to_frame_format(*ctx,(MppFrameFormat *)((long)ctx + 0x28));
      if (*(int *)((long)ctx + 0x24) == 0) {
        name_to_coding_type(*ctx,(MppCodingType *)((long)ctx + 0x24));
      }
    }
  }
  return RVar2;
}

Assistant:

RK_S32 mpi_enc_opt_i(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        size_t len = strnlen(next, MAX_FILE_NAME_LENGTH);
        if (len) {
            cmd->file_input = mpp_calloc(char, len + 1);
            strcpy(cmd->file_input, next);
            name_to_frame_format(cmd->file_input, &cmd->format);

            if (cmd->type_src == MPP_VIDEO_CodingUnused)
                name_to_coding_type(cmd->file_input, &cmd->type_src);
        }

        return 1;
    }

    mpp_err("input file is invalid\n");
    return 0;
}